

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O1

void __thiscall Manifold_Warp_Test::TestBody(Manifold_Warp_Test *this)

{
  char *pcVar1;
  initializer_list<manifold::Manifold> __l;
  AssertionResult gtest_ar;
  Manifold simplified;
  Manifold shape;
  CrossSection square;
  char *in_stack_ffffffffffffff38;
  AssertHelper local_c0;
  char local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  pointer in_stack_ffffffffffffff58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  Manifold local_90 [16];
  undefined8 local_80;
  Manifold local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_58;
  code *local_50;
  CrossSection local_48 [64];
  
  manifold::CrossSection::Square(0,0x3ff0000000000000,local_48,0);
  manifold::CrossSection::ToPolygons();
  manifold::Manifold::Extrude(0,0,0x3ff0000000000000,0,local_90,local_b8,10);
  local_68 = 0;
  uStack_60 = 0;
  local_50 = std::
             _Function_handler<void_(linalg::vec<double,_3>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp:365:58)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(linalg::vec<double,_3>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp:365:58)>
             ::_M_manager;
  manifold::Manifold::Warp(local_78,local_90);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  manifold::Manifold::~Manifold(local_90);
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::~vector((vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
             *)local_b8);
  manifold::Manifold::Manifold((Manifold *)&stack0xffffffffffffff60,local_78);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xffffffffffffff60;
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::vector
            ((vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> *)local_b8,__l,
             (allocator_type *)&local_c0);
  manifold::Manifold::Compose((vector *)local_90);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector
            ((vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> *)local_b8);
  manifold::Manifold::~Manifold((Manifold *)&stack0xffffffffffffff60);
  local_80 = manifold::Manifold::Volume();
  manifold::Manifold::Volume();
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffff38,(char *)0x141212,in_stack_ffffffffffffff68,
             (double)in_stack_ffffffffffffff60._M_head_impl,(double)in_stack_ffffffffffffff58,
             (double)in_stack_ffffffffffffff50);
  if (local_b8[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff60);
    if (in_stack_ffffffffffffff50 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffff50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x173,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&stack0xffffffffffffff60);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (in_stack_ffffffffffffff60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff60._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffff50 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff50,in_stack_ffffffffffffff50);
  }
  local_80 = manifold::Manifold::SurfaceArea();
  manifold::Manifold::SurfaceArea();
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffff38,(char *)0x1412db,in_stack_ffffffffffffff68,
             (double)in_stack_ffffffffffffff60._M_head_impl,(double)in_stack_ffffffffffffff58,
             (double)in_stack_ffffffffffffff50);
  if (local_b8[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff60);
    if (in_stack_ffffffffffffff50 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffff50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x174,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&stack0xffffffffffffff60);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff60._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffff50 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff50,in_stack_ffffffffffffff50);
  }
  manifold::Manifold::Volume();
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffff38,(char *)0x141393,in_stack_ffffffffffffff68,
             (double)in_stack_ffffffffffffff60._M_head_impl,(double)in_stack_ffffffffffffff58,
             (double)in_stack_ffffffffffffff50);
  if (local_b8[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff60);
    if (in_stack_ffffffffffffff50 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffff50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x175,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&stack0xffffffffffffff60);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffff60._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff60._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffff50 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff50,in_stack_ffffffffffffff50);
  }
  manifold::Manifold::~Manifold(local_90);
  manifold::Manifold::~Manifold(local_78);
  manifold::CrossSection::~CrossSection(local_48);
  return;
}

Assistant:

TEST(Manifold, Warp) {
  CrossSection square = CrossSection::Square({1, 1});
  Manifold shape =
      Manifold::Extrude(square.ToPolygons(), 2, 10).Warp([](vec3& v) {
        v.x += v.z * v.z;
      });

  Manifold simplified = Manifold::Compose({shape});

  EXPECT_NEAR(shape.Volume(), simplified.Volume(), 0.0001);
  EXPECT_NEAR(shape.SurfaceArea(), simplified.SurfaceArea(), 0.0001);
  EXPECT_NEAR(shape.Volume(), 2, 0.0001);
}